

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O0

void __thiscall EditorInterface::~EditorInterface(EditorInterface *this)

{
  bool bVar1;
  reference ppVar2;
  Drawable *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>
  *widget_1;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>
  *widget;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
  *__range1;
  uint numLeakedWidgets;
  pointer in_stack_ffffffffffffff48;
  reference in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff68;
  _Self local_80;
  _Self local_78;
  Drawable *local_70;
  size_type local_68;
  basic_string_view<char> local_60;
  reference local_50;
  _Self local_48;
  _Self local_40;
  Drawable *local_38;
  int local_2c;
  char *local_20;
  basic_string_view<char> *local_18;
  char *local_10;
  basic_string_view<char> *local_8;
  
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__EditorInterface_0047d948;
  std::__shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffff60);
  std::__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffff60);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::reset
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_ffffffffffffff50,
             (pointer)in_stack_ffffffffffffff48);
  std::unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_>::reset
            ((unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  local_2c = 0;
  local_38 = in_RDI + 2;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                *)in_stack_ffffffffffffff48);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
              *)in_stack_ffffffffffffff48);
  while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
    local_50 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
                            *)0x1ad024);
    bVar1 = std::__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>::expired
                      ((__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *)0x1ad037);
    if (!bVar1) {
      local_2c = local_2c + 1;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
                  *)in_stack_ffffffffffffff50);
  }
  if (local_2c != 0) {
    local_18 = &local_60;
    local_20 = "EditorInterface detected {} memory leaks out of {} registered widgets:";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (local_18,"EditorInterface detected {} memory leaks out of {} registered widgets:",
               0x46);
    local_68 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
               ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                       *)0x1ad0ac);
    spdlog::warn<unsigned_int&,unsigned_long>
              ((format_string_t<unsigned_int_&,_unsigned_long>)in_stack_ffffffffffffff68,
               (uint *)in_stack_ffffffffffffff60,(unsigned_long *)in_RDI);
    local_70 = in_RDI + 2;
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                  *)in_stack_ffffffffffffff48);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                *)in_stack_ffffffffffffff48);
    while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
                            *)0x1ad11d);
      bVar1 = std::__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>::expired
                        ((__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *)0x1ad130);
      if (!bVar1) {
        local_8 = (basic_string_view<char> *)&stack0xffffffffffffff68;
        local_10 = "  Widget \"{}\" not cleaned up! (ref count {}).";
        ::fmt::v11::basic_string_view<char>::basic_string_view
                  (local_8,"  Widget \"{}\" not cleaned up! (ref count {}).",0x2d);
        in_stack_ffffffffffffff60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>::use_count
                       ((__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *)0x1ad17d);
        spdlog::warn<std::__cxx11::string_const&,long>
                  ((format_string_t<const_std::__cxx11::basic_string<char>_&,_long>)
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(long *)in_RDI);
        in_stack_ffffffffffffff50 = ppVar2;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
                    *)in_stack_ffffffffffffff50);
    }
  }
  std::shared_ptr<gui::Panel>::~shared_ptr((shared_ptr<gui::Panel> *)0x1ad1c0);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ad1ce);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::~unique_ptr
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_ffffffffffffff60);
  std::unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_>::~unique_ptr
            ((unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_> *)in_stack_ffffffffffffff50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
          *)0x1ad1f8);
  sf::Drawable::~Drawable(in_RDI);
  return;
}

Assistant:

EditorInterface::~EditorInterface() {
    modalBackground_.reset();
    cursorLabel_.reset();
    theme_.reset();
    gui_.reset();

    unsigned int numLeakedWidgets = 0;
    for (const auto& widget : debugWidgets_) {
        if (!widget.second.expired()) {
            ++numLeakedWidgets;
        }
    }

    if (numLeakedWidgets > 0) {
        spdlog::warn("EditorInterface detected {} memory leaks out of {} registered widgets:", numLeakedWidgets, debugWidgets_.size());
        for (const auto& widget : debugWidgets_) {
            if (!widget.second.expired()) {
                spdlog::warn("  Widget \"{}\" not cleaned up! (ref count {}).", widget.first, widget.second.use_count());
            }
        }
    }
}